

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS ref_split_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  REF_INT RVar1;
  REF_CELL pRVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  REF_INT ncell;
  REF_INT new_cell;
  REF_INT nodes [27];
  REF_INT cell_to_split [100];
  int local_24c;
  REF_INT local_248;
  REF_INT local_244;
  REF_GRID local_240;
  REF_INT local_238 [28];
  REF_INT local_1c8 [102];
  
  pRVar2 = ref_grid->cell[8];
  uVar3 = ref_cell_list_with2(pRVar2,node0,node1,100,&local_24c,local_1c8);
  if (uVar3 != 7) {
    if (uVar3 == 0) {
      local_240 = ref_grid;
      if (0 < local_24c) {
        lVar5 = 0;
        local_248 = node1;
        do {
          RVar1 = local_1c8[lVar5];
          uVar3 = ref_cell_nodes(pRVar2,RVar1,local_238);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x19b,"ref_split_edge",(ulong)uVar3,"cell nodes");
            return uVar3;
          }
          uVar3 = ref_cell_remove(pRVar2,RVar1);
          node1 = local_248;
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x19c,"ref_split_edge",(ulong)uVar3,"remove");
            return uVar3;
          }
          if (0 < pRVar2->node_per) {
            lVar4 = 0;
            do {
              if (local_238[lVar4] == node0) {
                local_238[lVar4] = new_node;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < pRVar2->node_per);
          }
          uVar3 = ref_cell_add(pRVar2,local_238,&local_244);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x1a0,"ref_split_edge",(ulong)uVar3,"add node0 version");
            return uVar3;
          }
          if (0 < pRVar2->node_per) {
            lVar4 = 0;
            do {
              if (local_238[lVar4] == new_node) {
                local_238[lVar4] = node0;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < pRVar2->node_per);
          }
          if (0 < pRVar2->node_per) {
            lVar4 = 0;
            do {
              if (local_238[lVar4] == node1) {
                local_238[lVar4] = new_node;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < pRVar2->node_per);
          }
          uVar3 = ref_cell_add(pRVar2,local_238,&local_244);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x1a6,"ref_split_edge",(ulong)uVar3,"add node1 version");
            return uVar3;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_24c);
      }
      pRVar2 = local_240->cell[3];
      uVar3 = ref_cell_list_with2(pRVar2,node0,node1,100,&local_24c,local_1c8);
      if (uVar3 == 0) {
        if (0 < local_24c) {
          lVar5 = 0;
          local_248 = node1;
          do {
            RVar1 = local_1c8[lVar5];
            uVar3 = ref_cell_nodes(pRVar2,RVar1,local_238);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x1b0,"ref_split_edge",(ulong)uVar3,"cell nodes");
              return uVar3;
            }
            uVar3 = ref_cell_remove(pRVar2,RVar1);
            node1 = local_248;
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x1b1,"ref_split_edge",(ulong)uVar3,"remove");
              return uVar3;
            }
            if (0 < pRVar2->node_per) {
              lVar4 = 0;
              do {
                if (local_238[lVar4] == node0) {
                  local_238[lVar4] = new_node;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < pRVar2->node_per);
            }
            uVar3 = ref_cell_add(pRVar2,local_238,&local_244);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x1b5,"ref_split_edge",(ulong)uVar3,"add node0 version");
              return uVar3;
            }
            if (0 < pRVar2->node_per) {
              lVar4 = 0;
              do {
                if (local_238[lVar4] == new_node) {
                  local_238[lVar4] = node0;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < pRVar2->node_per);
            }
            if (0 < pRVar2->node_per) {
              lVar4 = 0;
              do {
                if (local_238[lVar4] == node1) {
                  local_238[lVar4] = new_node;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < pRVar2->node_per);
            }
            uVar3 = ref_cell_add(pRVar2,local_238,&local_244);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x1bb,"ref_split_edge",(ulong)uVar3,"add node1 version");
              return uVar3;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_24c);
        }
        pRVar2 = local_240->cell[0];
        uVar3 = ref_cell_list_with2(pRVar2,node0,node1,100,&local_24c,local_1c8);
        if (uVar3 == 0) {
          if (local_24c < 1) {
            uVar3 = 0;
          }
          else {
            local_240 = (REF_GRID)0x0;
            local_248 = node1;
            do {
              RVar1 = local_1c8[(long)local_240];
              uVar3 = ref_cell_nodes(pRVar2,RVar1,local_238);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x1c5,"ref_split_edge",(ulong)uVar3,"cell nodes");
                return uVar3;
              }
              uVar3 = ref_cell_remove(pRVar2,RVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x1c6,"ref_split_edge",(ulong)uVar3,"remove");
                return uVar3;
              }
              if (0 < pRVar2->node_per) {
                lVar5 = 0;
                do {
                  if (local_238[lVar5] == node0) {
                    local_238[lVar5] = new_node;
                  }
                  lVar5 = lVar5 + 1;
                } while (lVar5 < pRVar2->node_per);
              }
              uVar3 = ref_cell_add(pRVar2,local_238,&local_244);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x1ca,"ref_split_edge",(ulong)uVar3,"add node0 version");
                return uVar3;
              }
              if (0 < pRVar2->node_per) {
                lVar5 = 0;
                do {
                  if (local_238[lVar5] == new_node) {
                    local_238[lVar5] = node0;
                  }
                  lVar5 = lVar5 + 1;
                } while (lVar5 < pRVar2->node_per);
              }
              if (0 < pRVar2->node_per) {
                lVar5 = 0;
                do {
                  if (local_238[lVar5] == local_248) {
                    local_238[lVar5] = new_node;
                  }
                  lVar5 = lVar5 + 1;
                } while (lVar5 < pRVar2->node_per);
              }
              uVar3 = ref_cell_add(pRVar2,local_238,&local_244);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x1d0,"ref_split_edge",(ulong)uVar3,"add node1 version");
                return uVar3;
              }
              local_240 = (REF_GRID)((long)local_240 + 1);
              uVar3 = 0;
            } while ((long)local_240 < (long)local_24c);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x1c1,"ref_split_edge",(ulong)uVar3,
                 "get edg list, should have been smaller then tets");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
               0x1ac,"ref_split_edge",(ulong)uVar3,
               "get tri list, should have been smaller then tets");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x197
             ,"ref_split_edge",(ulong)uVar3,"tet list to split");
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_INT new_node) {
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell, cell_in_list;
  REF_INT cell_to_split[MAX_CELL_SPLIT];
  REF_INT node, new_cell;
  REF_STATUS status;

  ref_cell = ref_grid_tet(ref_grid);
  status = ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                               cell_to_split);
  if (REF_INCREASE_LIMIT == status) return status;
  RSS(status, "tet list to split");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                          cell_to_split),
      "get tri list, should have been smaller then tets");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_SPLIT, &ncell,
                          cell_to_split),
      "get edg list, should have been smaller then tets");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_split[cell_in_list];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
  }

  return REF_SUCCESS;
}